

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O1

void __thiscall glu::TextureCube::upload(TextureCube *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  code *pcVar3;
  pointer pPVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  TransferFormat TVar10;
  TestError *this_00;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long local_80;
  long lVar9;
  
  iVar6 = (*this->m_context->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  if (this->m_glTexture != 0) {
    (**(code **)(lVar9 + 0xb8))(0x8513);
    pcVar3 = *(code **)(lVar9 + 0xff0);
    uVar7 = tcu::TextureFormat::getPixelSize(&(this->m_refTexture).m_format);
    uVar11 = 8;
    if ((int)uVar7 < 8) {
      uVar11 = uVar7;
    }
    uVar12 = 1;
    if ((uVar7 & uVar7 - 1) == 0) {
      uVar12 = uVar11;
    }
    (*pcVar3)(0xcf5,uVar12);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    checkError(dVar8,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x185);
    TVar10 = getTransferFormat((this->m_refTexture).m_format);
    local_80 = 0;
    do {
      if (0 < (int)((ulong)((long)(this->m_refTexture).m_access[0].
                                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_refTexture).m_access[0].
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
        lVar13 = 8;
        lVar15 = 8;
        uVar14 = 0;
        do {
          if (*(long *)((long)&((this->m_refTexture).m_data[local_80].
                                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar15) != 0) {
            pPVar4 = (this->m_refTexture).m_access[local_80].
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar1 = *(undefined4 *)
                     ((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data + lVar13 + -8);
            uVar2 = *(undefined4 *)
                     ((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data + lVar13 + -4);
            uVar5 = *(undefined8 *)
                     ((long)(pPVar4->super_ConstPixelBufferAccess).m_pitch.m_data + lVar13 + 4);
            pcVar3 = *(code **)(lVar9 + 0x1310);
            dVar8 = getGLCubeFace((CubeFace)local_80);
            (*pcVar3)(dVar8,uVar14 & 0xffffffff,this->m_format,uVar1,uVar2,0,TVar10,
                      (ulong)TVar10 >> 0x20,uVar5);
          }
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 0x10;
          lVar13 = lVar13 + 0x28;
        } while ((long)uVar14 <
                 (long)((int)((ulong)((long)(this->m_refTexture).m_access[0].
                                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_refTexture).m_access[0].
                                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x33333333));
      }
      local_80 = local_80 + 1;
    } while (local_80 != 6);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    checkError(dVar8,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x196);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x182);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCube::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	DE_ASSERT(!m_isCompressed);

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
		{
			if (m_refTexture.isLevelEmpty((tcu::CubeFace)face, levelNdx))
				continue; // Don't upload.

			tcu::ConstPixelBufferAccess access = m_refTexture.getLevelFace(levelNdx, (tcu::CubeFace)face);
			DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
			gl.texImage2D(getGLCubeFace((tcu::CubeFace)face), levelNdx, m_format, access.getWidth(), access.getHeight(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}